

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

void __thiscall setup::registry_entry::load(registry_entry *this,istream *is,info *i)

{
  istream **ppiVar1;
  byte bVar2;
  uint16_t uVar3;
  unsigned_short uVar4;
  hive_name hVar5;
  value_type vVar6;
  undefined1 *puVar7;
  logger *plVar8;
  flag_type fVar9;
  ulong uVar10;
  stored_flag_reader<flags<setup::registry_entry::flags_Enum_,_12UL>_> flagreader;
  
  if ((i->version).value < 0x1030000) {
    util::load<int,util::little_endian>(is);
  }
  flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.pad_bits =
       (size_t)&this->key;
  flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.pos =
       (size_t)&(i->header).lead_bytes;
  flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.stream =
       (istream *)
       CONCAT44(flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.stream._4_4_
                ,i->codepage);
  util::operator>>(is,(encoded_string *)&flagreader);
  uVar3 = version::bits(&i->version);
  if (uVar3 == 0x10) {
    (this->name)._M_string_length = 0;
    *(this->name)._M_dataplus._M_p = '\0';
  }
  else {
    flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.pad_bits =
         (size_t)&this->name;
    flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.stream =
         (istream *)
         CONCAT44(flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.stream.
                  _4_4_,i->codepage);
    flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.pos = 0;
    util::operator>>(is,(encoded_string *)&flagreader);
  }
  util::binary_string::load(is,&this->value);
  item::load_condition_data(&this->super_item,is,i);
  if ((i->version).value + 0xfbfff500 < 0xf500) {
    util::binary_string::load(is,&this->permissions);
  }
  else {
    (this->permissions)._M_string_length = 0;
    *(this->permissions)._M_dataplus._M_p = '\0';
  }
  windows_version_range::load(&(this->super_item).winver,is,&i->version);
  uVar3 = version::bits(&i->version);
  if (uVar3 == 0x10) {
    hVar5 = Unset;
  }
  else {
    hVar5 = util::load<int,util::little_endian>(is);
    hVar5 = hVar5 & 0x7fffffff;
  }
  this->hive = hVar5;
  if ((i->version).value < 0x4010000) {
    this->permission = -1;
LAB_0013a366:
    uVar3 = version::bits(&i->version);
    bVar2 = util::load<unsigned_char,util::little_endian>(is);
    uVar10 = (ulong)bVar2;
    if (uVar3 == 0x10) {
      if (1 < bVar2) {
        ppiVar1 = &flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.stream;
        flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.pad_bits =
             CONCAT44(flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.
                      pad_bits._4_4_,2);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppiVar1);
        std::operator<<((ostream *)ppiVar1,"Unexpected ");
        plVar8 = logger::operator<<((logger *)&flagreader,
                                    &enum_names<setup::registry_entry::value_type>::name);
        std::operator<<((ostream *)&plVar8->buffer," value: ");
        std::ostream::_M_insert<unsigned_long>((ulong)&plVar8->buffer);
LAB_0013a4b0:
        logger::~logger((logger *)&flagreader);
        vVar6 = None;
        goto LAB_0013a4bc;
      }
      puVar7 = (undefined1 *)&(anonymous_namespace)::stored_registry_entry_type_0::values;
    }
    else {
      if (5 < bVar2) {
        ppiVar1 = &flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.stream;
        flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.pad_bits =
             CONCAT44(flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.
                      pad_bits._4_4_,2);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppiVar1);
        std::operator<<((ostream *)ppiVar1,"Unexpected ");
        plVar8 = logger::operator<<((logger *)&flagreader,
                                    &enum_names<setup::registry_entry::value_type>::name);
        std::operator<<((ostream *)&plVar8->buffer," value: ");
        std::ostream::_M_insert<unsigned_long>((ulong)&plVar8->buffer);
        goto LAB_0013a4b0;
      }
      puVar7 = (anonymous_namespace)::stored_registry_entry_type_1::values;
    }
  }
  else {
    uVar4 = util::load<short,util::little_endian>(is);
    this->permission = (int)(short)uVar4;
    if ((i->version).value < 0x5020500) goto LAB_0013a366;
    bVar2 = util::load<unsigned_char,util::little_endian>(is);
    uVar10 = (ulong)bVar2;
    if (6 < bVar2) {
      ppiVar1 = &flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.stream;
      flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.pad_bits =
           CONCAT44(flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.pad_bits
                    ._4_4_,2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppiVar1);
      std::operator<<((ostream *)ppiVar1,"Unexpected ");
      plVar8 = logger::operator<<((logger *)&flagreader,
                                  &enum_names<setup::registry_entry::value_type>::name);
      std::operator<<((ostream *)&plVar8->buffer," value: ");
      std::ostream::_M_insert<unsigned_long>((ulong)&plVar8->buffer);
      goto LAB_0013a4b0;
    }
    puVar7 = (anonymous_namespace)::stored_registry_entry_type_2::values;
  }
  vVar6 = *(value_type *)((long)puVar7 + uVar10 * 4);
LAB_0013a4bc:
  this->type = vVar6;
  uVar3 = version::bits(&i->version);
  flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.pad_bits = (size_t)uVar3;
  flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.pos = 0;
  flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.buffer = '\0';
  flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.result._flags.
  super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
  flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.bytes = 0;
  flagreader.super_stored_flag_reader<setup::registry_entry::flags_Enum_>.stream = is;
  uVar3 = version::bits(&i->version);
  if (uVar3 != 0x10) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,VersionInfoValid);
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,VersionInfoNotValid
              );
  }
  stored_flag_reader<setup::data_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,TimeStampInUTC);
  stored_flag_reader<setup::data_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,IsUninstallerExe);
  stored_flag_reader<setup::data_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,
             CallInstructionOptimized);
  if (0x10205ff < (i->version).value) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,Touch);
    if (0x10308ff < (i->version).value) {
      stored_flag_reader<setup::data_entry::flags_Enum_>::add
                ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,ChunkEncrypted);
      stored_flag_reader<setup::data_entry::flags_Enum_>::add
                ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,ChunkCompressed);
      if (0x1030bff < (i->version).value) {
        stored_flag_reader<setup::data_entry::flags_Enum_>::add
                  ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,SolidBreak);
        if (0x1030fff < (i->version).value) {
          stored_flag_reader<setup::data_entry::flags_Enum_>::add
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,Sign);
          if (0x500ffff < (i->version).value) {
            stored_flag_reader<setup::data_entry::flags_Enum_>::add
                      ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,SignOnce);
            stored_flag_reader<setup::data_entry::flags_Enum_>::add
                      ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,BZipped);
          }
        }
      }
    }
  }
  fVar9 = stored_flag_reader<setup::data_entry::flags_Enum_>::finalize
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader);
  (this->options)._flags.super__Base_bitset<1UL>._M_w =
       (_WordT)fVar9._flags.super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

void registry_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(key, i.codepage, i.header.lead_bytes);
	if(i.version.bits() != 16) {
		is >> util::encoded_string(name, i.codepage);
	} else {
		name.clear();
	}
	is >> util::binary_string(value);
	
	load_condition_data(is, i);
	
	if(i.version >= INNO_VERSION(4, 0, 11) && i.version < INNO_VERSION(4, 1, 0)) {
		is >> util::binary_string(permissions);
	} else {
		permissions.clear();
	}
	
	load_version_data(is, i.version);
	
	if(i.version.bits() != 16) {
		hive = hive_name(util::load<boost::uint32_t>(is) & ~0x80000000);
	} else {
		hive = Unset;
	}
	
	if(i.version >= INNO_VERSION(4, 1, 0)) {
		permission = util::load<boost::int16_t>(is);
	} else {
		permission = -1;
	}
	
	if(i.version >= INNO_VERSION(5, 2, 5)) {
		type = stored_enum<stored_registry_entry_type_2>(is).get();
	} else if(i.version.bits() != 16) {
		type = stored_enum<stored_registry_entry_type_1>(is).get();
	} else {
		type = stored_enum<stored_registry_entry_type_0>(is).get();
	}
	
	stored_flag_reader<flags> flagreader(is, i.version.bits());
	
	if(i.version.bits() != 16) {
		flagreader.add(CreateValueIfDoesntExist);
		flagreader.add(UninsDeleteValue);
	}
	flagreader.add(UninsClearValue);
	flagreader.add(UninsDeleteEntireKey);
	flagreader.add(UninsDeleteEntireKeyIfEmpty);
	if(i.version >= INNO_VERSION(1, 2, 6)) {
		flagreader.add(PreserveStringType);
	}
	if(i.version >= INNO_VERSION(1, 3, 9)) {
		flagreader.add(DeleteKey);
		flagreader.add(DeleteValue);
	}
	if(i.version >= INNO_VERSION(1, 3, 12)) {
		flagreader.add(NoError);
	}
	if(i.version >= INNO_VERSION(1, 3, 16)) {
		flagreader.add(DontCreateKey);
	}
	if(i.version >= INNO_VERSION(5, 1, 0)) {
		flagreader.add(Bits32);
		flagreader.add(Bits64);
	}
	
	options = flagreader.finalize();
}